

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O3

void __thiscall Signal::~Signal(Signal *this)

{
  code *pcVar1;
  int iVar2;
  
  iVar2 = pthread_cond_destroy((pthread_cond_t *)this);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                          ,0x1e,"pthread_cond_destroy((pthread_cond_t*)cdata) == 0");
    if (iVar2 != 0) goto LAB_00105da1;
  }
  iVar2 = pthread_mutex_destroy((pthread_mutex_t *)this->mdata);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                          ,0x1f,"pthread_mutex_destroy((pthread_mutex_t*)mdata) == 0");
    if (iVar2 != 0) {
LAB_00105da1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

Signal::~Signal()
{
#ifdef _WIN32
  VERIFY(CloseHandle(handle));
#else
  VERIFY(pthread_cond_destroy((pthread_cond_t*)cdata) == 0);
  VERIFY(pthread_mutex_destroy((pthread_mutex_t*)mdata) == 0);
#endif
}